

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxml2cpp.cpp
# Opt level: O2

QString * constRefArg(QString *__return_storage_ptr__,QByteArray *arg)

{
  ulong uVar1;
  long in_FS_OFFSET;
  QAnyStringView QVar2;
  QStringBuilder<QLatin1String,_QLatin1String> local_48;
  undefined1 *local_28;
  undefined8 local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.a.m_data = (arg->d).ptr;
  uVar1 = (arg->d).size;
  if ((uVar1 == 0) || (*local_48.a.m_data != 'Q')) {
    local_48.b.m_size = 1;
    local_48.b.m_data = " ";
    local_48.a.m_size = uVar1;
    QStringBuilder<QLatin1String,_QLatin1String>::convertTo<QString>
              (__return_storage_ptr__,&local_48);
  }
  else {
    local_48.a.m_size = CONCAT71(local_48.a.m_size._1_7_,1);
    local_20 = 0;
    local_48.b.m_size = uVar1 | 0x4000000000000000;
    QVar2.m_size = (size_t)"const %1 &";
    QVar2.field_0.m_data = __return_storage_ptr__;
    local_28 = (undefined1 *)&local_48;
    QtPrivate::argToQString(QVar2,0x400000000000000a,(ArgBase **)0x1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString constRefArg(const QByteArray &arg)
{
    if (!arg.startsWith('Q'))
        return QLatin1StringView(arg) + " "_L1;
    else
        return "const %1 &"_L1.arg(QLatin1StringView(arg));
}